

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void rw::ps2::convertPalette(Raster *raster)

{
  Raster *raster_local;
  
  if ((raster->format & 0x2000U) != 0) {
    if ((raster->format & 0xf00U) == 0x500) {
      convertCSM1_32((uint32 *)raster->palette);
    }
    else if ((raster->format & 0xf00U) == 0x500) {
      convertCSM1_16((uint32 *)raster->palette);
    }
  }
  return;
}

Assistant:

static void
convertPalette(Raster *raster)
{
	if(raster->format & Raster::PAL8){
		if((raster->format & 0xF00) == Raster::C8888)
			convertCSM1_32((uint32*)raster->palette);
		else if((raster->format & 0xF00) == Raster::C8888)
			convertCSM1_16((uint32*)raster->palette);
	}
}